

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  byte local_19;
  _Bool dead_connection_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((conn->easyq).size == 0) || (dead_connection)) {
    if (conn->dns_entry != (Curl_dns_entry *)0x0) {
      Curl_resolv_unlock(data,conn->dns_entry);
      conn->dns_entry = (Curl_dns_entry *)0x0;
    }
    Curl_http_auth_cleanup_ntlm(conn);
    local_19 = dead_connection;
    if (conn->connect_only != '\0') {
      local_19 = 1;
    }
    Curl_attach_connection(data,conn);
    if (conn->handler->disconnect != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr__Bool *)0x0) {
      (*conn->handler->disconnect)(data,conn,(_Bool)(local_19 & 1));
    }
    conn_shutdown(data,conn);
    Curl_detach_connection(data);
    conn_free(conn);
  }
  return;
}

Assistant:

void Curl_disconnect(struct Curl_easy *data,
                     struct connectdata *conn, bool dead_connection)
{
  /* there must be a connection to close */
  DEBUGASSERT(conn);

  /* it must be removed from the connection cache */
  DEBUGASSERT(!conn->bundle);

  /* there must be an associated transfer */
  DEBUGASSERT(data);

  /* the transfer must be detached from the connection */
  DEBUGASSERT(!data->conn);

  /*
   * If this connection isn't marked to force-close, leave it open if there
   * are other users of it
   */
  if(CONN_INUSE(conn) && !dead_connection) {
    DEBUGF(infof(data, "Curl_disconnect when inuse: %zu", CONN_INUSE(conn)));
    return;
  }

  if(conn->dns_entry) {
    Curl_resolv_unlock(data, conn->dns_entry);
    conn->dns_entry = NULL;
  }

  /* Cleanup NTLM connection-related data */
  Curl_http_auth_cleanup_ntlm(conn);

  /* Cleanup NEGOTIATE connection-related data */
  Curl_http_auth_cleanup_negotiate(conn);

  if(conn->connect_only)
    /* treat the connection as dead in CONNECT_ONLY situations */
    dead_connection = TRUE;

  /* temporarily attach the connection to this transfer handle for the
     disconnect and shutdown */
  Curl_attach_connection(data, conn);

  if(conn->handler->disconnect)
    /* This is set if protocol-specific cleanups should be made */
    conn->handler->disconnect(data, conn, dead_connection);

  conn_shutdown(data, conn);

  /* detach it again */
  Curl_detach_connection(data);

  conn_free(conn);
}